

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testInit(XFBExceedBufferLimitTest *this)

{
  value_type local_20;
  testCase test_case;
  GLuint stage;
  GLuint c;
  XFBExceedBufferLimitTest *this_local;
  
  for (test_case.m_stage = COMPUTE; test_case.m_stage < TESS_EVAL;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_case = BLOCK; test_case.m_case < 6;
        test_case.m_case = test_case.m_case + GLOBAL) {
      if (((test_case.m_case != BLOCK) && (test_case.m_case != VECTOR)) && (test_case.m_case != 5))
      {
        local_20.m_case = test_case.m_stage;
        local_20.m_stage = test_case.m_case;
        std::
        vector<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_20);
      }
    }
  }
  return;
}

Assistant:

void XFBExceedBufferLimitTest::testInit()
{
	for (GLuint c = 0; c < CASE_MAX; ++c)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			testCase test_case = { (CASES)c, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}